

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O2

nbt_node * nbt_find(nbt_node *tree,nbt_predicate_t predicate,void *aux)

{
  nbt_list *pnVar1;
  list_head *plVar2;
  _Bool _Var3;
  nbt_node *pnVar4;
  
  if (tree != (nbt_node *)0x0) {
    _Var3 = (*predicate)(tree,aux);
    if (_Var3) {
      return tree;
    }
    if (tree->type - TAG_LIST < 2) {
      pnVar1 = (tree->payload).tag_list;
      plVar2 = &pnVar1->entry;
      do {
        plVar2 = plVar2->flink;
        if (plVar2 == &pnVar1->entry) {
          return (nbt_node *)0x0;
        }
        pnVar4 = nbt_find((nbt_node *)plVar2[-1].flink,predicate,aux);
      } while (pnVar4 == (nbt_node *)0x0);
      return pnVar4;
    }
  }
  return (nbt_node *)0x0;
}

Assistant:

nbt_node* nbt_find(nbt_node* tree, nbt_predicate_t predicate, void* aux)
{
    if(tree == NULL)                  return NULL;
    if(predicate(tree, aux))          return tree;
    if(tree->type != TAG_LIST &&
       tree->type != TAG_COMPOUND)    return NULL;

    struct list_head* pos;
    struct nbt_list* list = tree->type == TAG_LIST ? tree->payload.tag_list : tree->payload.tag_compound;
    
    list_for_each(pos, &list->entry)
    {
        struct nbt_list* p = list_entry(pos, struct nbt_list, entry);
        struct nbt_node* found;

        if((found = nbt_find(p->data, predicate, aux)))
            return found;
    }

    return NULL;
}